

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

int yang_read_extcomplex_str
              (lys_module *module,lys_ext_instance_complex *ext,char *arg_name,char *parent_name,
              char *value,int parent_stmt,LY_STMT stmt)

{
  size_t __size;
  long *plVar1;
  char *pcVar2;
  long *plVar3;
  void *pvVar4;
  long lVar5;
  undefined1 *puVar6;
  LY_ERR *pLVar7;
  ulong uVar8;
  int iVar9;
  LY_ECODE code;
  long lVar10;
  lyext_substmt *local_40;
  lyext_substmt *info;
  
  if (parent_stmt == 3 && stmt == LY_STMT_PREFIX) {
    plVar1 = (long *)lys_ext_complex_get_substmt(LY_STMT_BELONGSTO,ext,&local_40);
    if (local_40->cardinality < LY_STMT_CARD_SOME) {
      plVar1 = plVar1 + 1;
      uVar8 = 0;
    }
    else {
      uVar8 = 0xffffffffffffffff;
      do {
        lVar10 = uVar8 * 8;
        uVar8 = uVar8 + 1;
      } while (*(long *)(*plVar1 + 0x10 + lVar10) != 0);
      plVar1 = (long *)plVar1[1];
      uVar8 = uVar8 & 0xffffffff;
    }
    pcVar2 = lydict_insert_zc(module->ctx,value);
    plVar1[uVar8] = (long)pcVar2;
    return 0;
  }
  info = (lyext_substmt *)module;
  plVar1 = (long *)lys_ext_complex_get_substmt(stmt,ext,&local_40);
  if (plVar1 == (long *)0x0) {
    code = LYE_INCHILDSTMT;
  }
  else {
    if ((LY_STMT_CARD_MAND < local_40->cardinality) || (*plVar1 == 0)) {
      if (local_40->cardinality < LY_STMT_CARD_SOME) {
        iVar9 = 0;
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)*plVar1;
        if (plVar3 == (long *)0x0) {
          pvVar4 = calloc(2,8);
          *plVar1 = (long)pvVar4;
          iVar9 = 0;
          if (stmt == LY_STMT_ARGUMENT) {
            puVar6 = (undefined1 *)calloc(2,1);
            plVar1[1] = (long)puVar6;
            *puVar6 = 2;
          }
          else if (stmt == LY_STMT_BELONGSTO) {
            pvVar4 = calloc(2,8);
            plVar1[1] = (long)pvVar4;
          }
        }
        else {
          iVar9 = -1;
          do {
            iVar9 = iVar9 + 1;
            lVar10 = *plVar3;
            plVar3 = plVar3 + 1;
          } while (lVar10 != 0);
        }
        plVar3 = plVar1;
        plVar1 = (long *)*plVar1;
      }
      pcVar2 = lydict_insert_zc(*(ly_ctx **)info,value);
      lVar10 = (long)iVar9;
      plVar1[lVar10] = (long)pcVar2;
      if (iVar9 == 0) {
        return 0;
      }
      __size = lVar10 * 8 + 0x10;
      pvVar4 = realloc((void *)*plVar3,__size);
      if (pvVar4 == (void *)0x0) {
        pLVar7 = ly_errno_location();
        *pLVar7 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_read_extcomplex_str");
        lydict_remove(*(ly_ctx **)info,*(char **)(*plVar3 + lVar10 * 8));
        lVar5 = *plVar3;
      }
      else {
        *plVar3 = (long)pvVar4;
        *(undefined8 *)((long)pvVar4 + lVar10 * 8 + 8) = 0;
        if (stmt == LY_STMT_ARGUMENT) {
          pvVar4 = realloc((void *)plVar3[1],lVar10 + 2);
          if (pvVar4 == (void *)0x0) {
            pLVar7 = ly_errno_location();
            *pLVar7 = LY_EMEM;
            ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_read_extcomplex_str");
            *(undefined1 *)(plVar3[1] + lVar10) = 0;
            return 1;
          }
          plVar3[1] = (long)pvVar4;
          *(undefined1 *)((long)pvVar4 + lVar10 + 1) = 0;
          return 0;
        }
        if (stmt != LY_STMT_BELONGSTO) {
          return 0;
        }
        pvVar4 = realloc((void *)plVar3[1],__size);
        if (pvVar4 != (void *)0x0) {
          plVar3[1] = (long)pvVar4;
          *(undefined8 *)((long)pvVar4 + lVar10 * 8 + 8) = 0;
          return 0;
        }
        pLVar7 = ly_errno_location();
        *pLVar7 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_read_extcomplex_str");
        lydict_remove(*(ly_ctx **)info,*(char **)(plVar3[1] + lVar10 * 8));
        lVar5 = plVar3[1];
      }
      *(undefined8 *)(lVar5 + lVar10 * 8) = 0;
      return 1;
    }
    code = LYE_TOOMANY;
  }
  ly_vlog(code,LY_VLOG_NONE,(void *)0x0,arg_name,parent_name);
  free(value);
  return 1;
}

Assistant:

int
yang_read_extcomplex_str(struct lys_module *module, struct lys_ext_instance_complex *ext, const char *arg_name,
                         const char *parent_name, char *value, int parent_stmt, LY_STMT stmt)
{
    int c;
    const char **str, ***p = NULL;
    void *reallocated;
    struct lyext_substmt *info;

    c = 0;
    if (stmt == LY_STMT_PREFIX && parent_stmt == LY_STMT_BELONGSTO) {
        /* str contains no NULL value */
        str = lys_ext_complex_get_substmt(LY_STMT_BELONGSTO, ext, &info);
        if (info->cardinality < LY_STMT_CARD_SOME) {
            str++;
        } else {
           /* get the index in the array to add new item */
            p = (const char ***)str;
            for (c = 0; p[0][c + 1]; c++);
            str = p[1];
        }
        str[c] = lydict_insert_zc(module->ctx, value);
    }  else {
        str = lys_ext_complex_get_substmt(stmt, ext, &info);
        if (!str) {
            LOGVAL(LYE_INCHILDSTMT, LY_VLOG_NONE, NULL, arg_name, parent_name);
            free(value);
            return EXIT_FAILURE;
        }
        if (info->cardinality < LY_STMT_CARD_SOME && *str) {
            LOGVAL(LYE_TOOMANY, LY_VLOG_NONE, NULL, arg_name, parent_name);
            free(value);
            return EXIT_FAILURE;
        }

        if (info->cardinality >= LY_STMT_CARD_SOME) {
            /* there can be multiple instances, str is actually const char *** */
            p = (const char ***)str;
            if (!p[0]) {
                /* allocate initial array */
                p[0] = calloc(2, sizeof(const char *));
                if (stmt == LY_STMT_BELONGSTO) {
                    /* allocate another array for the belongs-to's prefixes */
                    p[1] = calloc(2, sizeof(const char *));
                } else if (stmt == LY_STMT_ARGUMENT) {
                    /* allocate another array for the yin element */
                    ((uint8_t **)p)[1] = calloc(2, sizeof(uint8_t));
                    /* default value of yin element */
                    ((uint8_t *)p[1])[0] = 2;
                }
            } else {
                /* get the index in the array to add new item */
                for (c = 0; p[0][c]; c++);
            }
            str = p[0];
        }

        str[c] = lydict_insert_zc(module->ctx, value);

        if (c) {
            /* enlarge the array(s) */
            reallocated = realloc(p[0], (c + 2) * sizeof(const char *));
            if (!reallocated) {
                LOGMEM;
                lydict_remove(module->ctx, p[0][c]);
                p[0][c] = NULL;
                return EXIT_FAILURE;
            }
            p[0] = reallocated;
            p[0][c + 1] = NULL;

            if (stmt == LY_STMT_BELONGSTO) {
                /* enlarge the second belongs-to's array with prefixes */
                reallocated = realloc(p[1], (c + 2) * sizeof(const char *));
                if (!reallocated) {
                    LOGMEM;
                    lydict_remove(module->ctx, p[1][c]);
                    p[1][c] = NULL;
                    return EXIT_FAILURE;
                }
                p[1] = reallocated;
                p[1][c + 1] = NULL;
            } else if (stmt == LY_STMT_ARGUMENT) {
                /* enlarge the second argument's array with yin element */
                reallocated = realloc(p[1], (c + 2) * sizeof(uint8_t));
                if (!reallocated) {
                    LOGMEM;
                    ((uint8_t *)p[1])[c] = 0;
                    return EXIT_FAILURE;
                }
                p[1] = reallocated;
                ((uint8_t *)p[1])[c + 1] = 0;
            }
        }
    }

    return EXIT_SUCCESS;
}